

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult> *
wasm::WATParser::anon_unknown_0::annotation
          (optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
           *__return_storage_ptr__,string_view in)

{
  bool bVar1;
  size_type sVar2;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  LexIntResult *this;
  LexFloatResult *this_00;
  LexStrResult *this_01;
  LexIdResult *this_02;
  size_type sVar4;
  size_t sVar5;
  char *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  string_view sVar7;
  string_view in_00;
  string_view in_01;
  string_view in_02;
  string_view in_03;
  anon_unknown_0 *local_2e0;
  char *local_2d8;
  undefined1 local_2d0 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed_7;
  bool hasIdchar_1;
  anon_unknown_0 *local_2a0;
  char *local_298;
  undefined1 local_290 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> lexed_6;
  undefined1 local_228 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> lexed_5;
  undefined1 local_1d8 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult> lexed_4;
  undefined1 local_198 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> lexed_3;
  char *local_168;
  undefined1 local_160 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed_2;
  undefined1 local_138 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed_1;
  long local_118;
  size_t depth;
  anon_unknown_0 *local_108;
  char *local_100;
  undefined1 local_f8 [8];
  optional<wasm::WATParser::(anonymous_namespace)::LexResult> lexed;
  bool hasIdchar;
  string_view local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  string_view local_a8;
  size_t local_98;
  size_type size;
  char *local_88;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  size_t local_70;
  char *local_68;
  undefined1 local_60 [8];
  LexAnnotationCtx ctx;
  string_view in_local;
  
  local_68 = in._M_str;
  local_70 = in._M_len;
  ctx.contentsSize = local_70;
  LexAnnotationCtx::LexAnnotationCtx((LexAnnotationCtx *)local_60,in);
  local_80 = sv(";;@",3);
  bVar1 = LexCtx::takePrefix((LexCtx *)local_60,local_80);
  if (bVar1) {
    size = srcAnnotationKind;
    local_88 = DAT_03193e50;
    sVar7._M_str = DAT_03193e50;
    sVar7._M_len = srcAnnotationKind;
    LexAnnotationCtx::setKind((LexAnnotationCtx *)local_60,sVar7);
    LexAnnotationCtx::startContents((LexAnnotationCtx *)local_60);
    local_a8 = LexCtx::next((LexCtx *)local_60);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_a8,'\n',0);
    local_98 = sVar2;
    local_b8 = sv("",0);
    if (sVar2 == 0xffffffffffffffff) {
      local_c8 = LexCtx::next((LexCtx *)local_60);
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_c8);
      LexAnnotationCtx::takeContents((LexAnnotationCtx *)local_60,sVar4);
    }
    else {
      LexAnnotationCtx::takeContents((LexAnnotationCtx *)local_60,local_98);
    }
  }
  else {
    bVar6 = sv("(@",2);
    bVar1 = LexCtx::takePrefix((LexCtx *)local_60,bVar6);
    if (bVar1) {
      LexAnnotationCtx::startKind((LexAnnotationCtx *)local_60);
      lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
      _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
      _23_1_ = 0;
      while( true ) {
        sVar7 = LexCtx::next((LexCtx *)local_60);
        local_108 = (anon_unknown_0 *)sVar7._M_len;
        local_100 = sVar7._M_str;
        in_00._M_str = in_RCX;
        in_00._M_len = (size_t)local_100;
        idchar((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_f8,local_108,
               in_00);
        bVar1 = std::optional::operator_cast_to_bool((optional *)local_f8);
        if (!bVar1) break;
        LexAnnotationCtx::takeKind((LexAnnotationCtx *)local_60,1);
        lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
        _M_payload.super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
        _23_1_ = 1;
      }
      if ((lexed.super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
           ._M_payload.
           super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._23_1_ &
          1) == 0) {
        std::optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>::optional
                  (__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      LexAnnotationCtx::startContents((LexAnnotationCtx *)local_60);
      local_118 = 1;
      while( true ) {
        while( true ) {
          while( true ) {
            do {
              do {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      while( true ) {
                        bVar1 = LexCtx::empty((LexCtx *)local_60);
                        if (bVar1) {
                          std::optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>
                          ::optional(__return_storage_ptr__);
                          return __return_storage_ptr__;
                        }
                        join_0x00000010_0x00000000_ = LexCtx::next((LexCtx *)local_60);
                        space((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)
                              local_138,join_0x00000010_0x00000000_);
                        bVar1 = std::optional::operator_cast_to_bool((optional *)local_138);
                        if (!bVar1) break;
                        pbVar3 = &std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::
                                  operator->((optional<wasm::WATParser::(anonymous_namespace)::LexResult>
                                              *)local_138)->span;
                        sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar3);
                        LexAnnotationCtx::takeContents((LexAnnotationCtx *)local_60,sVar4);
                      }
                      join_0x00000010_0x00000000_ = LexCtx::next((LexCtx *)local_60);
                      in_01._M_str = in_RCX;
                      in_01._M_len = (size_t)local_168;
                      keyword((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)
                              local_160,
                              (anon_unknown_0 *)
                              lexed_3.
                              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIntResult,_true,_true>
                              ._M_payload.
                              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                              ._32_8_,in_01);
                      bVar1 = std::optional::operator_cast_to_bool((optional *)local_160);
                      if (!bVar1) break;
                      pbVar3 = &std::optional<wasm::WATParser::(anonymous_namespace)::LexResult>::
                                operator->((optional<wasm::WATParser::(anonymous_namespace)::LexResult>
                                            *)local_160)->span;
                      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size(pbVar3);
                      LexAnnotationCtx::takeContents((LexAnnotationCtx *)local_60,sVar4);
                    }
                    join_0x00000010_0x00000000_ = LexCtx::next((LexCtx *)local_60);
                    integer((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *)
                            local_198,join_0x00000010_0x00000000_);
                    bVar1 = std::optional::operator_cast_to_bool((optional *)local_198);
                    if (!bVar1) break;
                    this = std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::
                           operator->((optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>
                                       *)local_198);
                    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                      ((basic_string_view<char,_std::char_traits<char>_> *)this);
                    LexAnnotationCtx::takeContents((LexAnnotationCtx *)local_60,sVar4);
                  }
                  join_0x00000010_0x00000000_ = LexCtx::next((LexCtx *)local_60);
                  float_((optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult> *)
                         local_1d8,join_0x00000010_0x00000000_);
                  bVar1 = std::optional::operator_cast_to_bool((optional *)local_1d8);
                  if (!bVar1) break;
                  this_00 = std::optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult>::
                            operator->((optional<wasm::WATParser::(anonymous_namespace)::LexFloatResult>
                                        *)local_1d8);
                  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                    ((basic_string_view<char,_std::char_traits<char>_> *)this_00);
                  LexAnnotationCtx::takeContents((LexAnnotationCtx *)local_60,sVar4);
                }
                sVar7 = LexCtx::next((LexCtx *)local_60);
                str((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)local_228,
                    sVar7);
                bVar1 = std::optional::operator_cast_to_bool((optional *)local_228);
                if (bVar1) {
                  this_01 = std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::
                            operator->((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>
                                        *)local_228);
                  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                    ((basic_string_view<char,_std::char_traits<char>_> *)this_01);
                  LexAnnotationCtx::takeContents((LexAnnotationCtx *)local_60,sVar4);
                  lexed_6.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                  ._M_payload.
                  super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                  .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                  ._M_engaged = true;
                  lexed_6.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                  ._M_payload.
                  super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                  .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                  ._65_3_ = 0;
                }
                else {
                  lexed_6.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                  ._M_payload.
                  super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                  .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                  ._M_engaged = false;
                  lexed_6.
                  super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                  ._M_payload.
                  super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                  .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                  ._65_3_ = 0;
                }
                std::optional<wasm::WATParser::(anonymous_namespace)::LexStrResult>::~optional
                          ((optional<wasm::WATParser::(anonymous_namespace)::LexStrResult> *)
                           local_228);
              } while (lexed_6.
                       super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                       ._M_payload.
                       super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                       .
                       super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                       ._64_4_ != 0);
              sVar7 = LexCtx::next((LexCtx *)local_60);
              local_2a0 = (anon_unknown_0 *)sVar7._M_len;
              local_298 = sVar7._M_str;
              in_02._M_str = in_RCX;
              in_02._M_len = (size_t)local_298;
              ident((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)local_290,
                    local_2a0,in_02);
              bVar1 = std::optional::operator_cast_to_bool((optional *)local_290);
              if (bVar1) {
                this_02 = std::optional<wasm::WATParser::(anonymous_namespace)::LexIdResult>::
                          operator->((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                                      *)local_290);
                sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                                  ((basic_string_view<char,_std::char_traits<char>_> *)this_02);
                LexAnnotationCtx::takeContents((LexAnnotationCtx *)local_60,sVar4);
                lexed_6.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                ._M_payload.
                super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
                _M_engaged = true;
                lexed_6.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                ._M_payload.
                super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
                _65_3_ = 0;
              }
              else {
                lexed_6.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                ._M_payload.
                super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
                _M_engaged = false;
                lexed_6.
                super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                ._M_payload.
                super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                .super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>.
                _65_3_ = 0;
              }
              std::optional<wasm::WATParser::(anonymous_namespace)::LexIdResult>::~optional
                        ((optional<wasm::WATParser::(anonymous_namespace)::LexIdResult> *)local_290)
              ;
            } while (lexed_6.
                     super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexIdResult,_false,_false>
                     ._M_payload.
                     super__Optional_payload<wasm::WATParser::(anonymous_namespace)::LexIdResult,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexIdResult>
                     ._64_4_ != 0);
            bVar6 = sv("(@",2);
            sVar5 = LexCtx::startsWith((LexCtx *)local_60,bVar6);
            if (sVar5 == 0) break;
            LexAnnotationCtx::takeContents((LexAnnotationCtx *)local_60,2);
            lexed_7.
            super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
            _M_payload.
            super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._23_1_ =
                 0;
            while( true ) {
              sVar7 = LexCtx::next((LexCtx *)local_60);
              local_2e0 = (anon_unknown_0 *)sVar7._M_len;
              local_2d8 = sVar7._M_str;
              in_03._M_str = in_RCX;
              in_03._M_len = (size_t)local_2d8;
              idchar((optional<wasm::WATParser::(anonymous_namespace)::LexResult> *)local_2d0,
                     local_2e0,in_03);
              bVar1 = std::optional::operator_cast_to_bool((optional *)local_2d0);
              if (!bVar1) break;
              LexAnnotationCtx::takeContents((LexAnnotationCtx *)local_60,1);
              lexed_7.
              super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>.
              _M_payload.
              super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>._23_1_
                   = 1;
            }
            if ((lexed_7.
                 super__Optional_base<wasm::WATParser::(anonymous_namespace)::LexResult,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<wasm::WATParser::(anonymous_namespace)::LexResult>.
                 _23_1_ & 1) == 0) {
              std::optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>::optional
                        (__return_storage_ptr__);
              return __return_storage_ptr__;
            }
            local_118 = local_118 + 1;
          }
          bVar6 = sv("(",1);
          sVar5 = LexCtx::startsWith((LexCtx *)local_60,bVar6);
          if (sVar5 == 0) break;
          LexAnnotationCtx::takeContents((LexAnnotationCtx *)local_60,1);
          local_118 = local_118 + 1;
        }
        bVar6 = sv(")",1);
        sVar5 = LexCtx::startsWith((LexCtx *)local_60,bVar6);
        if (sVar5 == 0) {
          std::optional<wasm::WATParser::(anonymous_namespace)::LexAnnotationResult>::optional
                    (__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        local_118 = local_118 + -1;
        if (local_118 == 0) break;
        LexAnnotationCtx::takeContents((LexAnnotationCtx *)local_60,1);
      }
      LexCtx::take((LexCtx *)local_60,1);
    }
  }
  LexAnnotationCtx::lexed(__return_storage_ptr__,(LexAnnotationCtx *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexAnnotationResult> annotation(std::string_view in) {
  LexAnnotationCtx ctx(in);
  if (ctx.takePrefix(";;@"sv)) {
    ctx.setKind(srcAnnotationKind.str);
    ctx.startContents();
    if (auto size = ctx.next().find('\n'); size != ""sv.npos) {
      ctx.takeContents(size);
    } else {
      ctx.takeContents(ctx.next().size());
    }
  } else if (ctx.takePrefix("(@"sv)) {
    ctx.startKind();
    bool hasIdchar = false;
    while (auto lexed = idchar(ctx.next())) {
      ctx.takeKind(1);
      hasIdchar = true;
    }
    if (!hasIdchar) {
      return std::nullopt;
    }
    ctx.startContents();
    size_t depth = 1;
    while (true) {
      if (ctx.empty()) {
        return std::nullopt;
      }
      if (auto lexed = space(ctx.next())) {
        ctx.takeContents(lexed->span.size());
        continue;
      }
      if (auto lexed = keyword(ctx.next())) {
        ctx.takeContents(lexed->span.size());
        continue;
      }
      if (auto lexed = integer(ctx.next())) {
        ctx.takeContents(lexed->span.size());
        continue;
      }
      if (auto lexed = float_(ctx.next())) {
        ctx.takeContents(lexed->span.size());
        continue;
      }
      if (auto lexed = str(ctx.next())) {
        ctx.takeContents(lexed->span.size());
        continue;
      }
      if (auto lexed = ident(ctx.next())) {
        ctx.takeContents(lexed->span.size());
        continue;
      }
      if (ctx.startsWith("(@"sv)) {
        ctx.takeContents(2);
        bool hasIdchar = false;
        while (auto lexed = idchar(ctx.next())) {
          ctx.takeContents(1);
          hasIdchar = true;
        }
        if (!hasIdchar) {
          return std::nullopt;
        }
        ++depth;
        continue;
      }
      if (ctx.startsWith("("sv)) {
        ctx.takeContents(1);
        ++depth;
        continue;
      }
      if (ctx.startsWith(")"sv)) {
        --depth;
        if (depth == 0) {
          ctx.take(1);
          break;
        }
        ctx.takeContents(1);
        continue;
      }
      // Unrecognized token.
      return std::nullopt;
    }
  }
  return ctx.lexed();
}